

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall irr::video::COpenGLDriver::createMaterialRenderers(COpenGLDriver *this)

{
  IMaterialRenderer *pIVar1;
  
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x2677f0;
  *(undefined8 *)&pIVar1->field_0x10 = 0x267848;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x267908;
  *(undefined8 *)&pIVar1->field_0x10 = 0x267960;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x267a20;
  *(undefined8 *)&pIVar1->field_0x10 = 0x267a78;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x267b38;
  *(undefined8 *)&pIVar1->field_0x10 = 0x267b90;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x267c50;
  *(undefined8 *)&pIVar1->field_0x10 = 0x267ca8;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  return;
}

Assistant:

void COpenGLDriver::createMaterialRenderers()
{
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_SOLID(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_ONETEXTURE_BLEND(this));
}